

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

string * __thiscall
cmCTestGIT::GetWorkingRevision_abi_cxx11_(string *__return_storage_ptr__,cmCTestGIT *this)

{
  char *git_rev_list [7];
  OutputLogger err;
  OneLineParser out;
  pointer local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  undefined8 local_a8;
  OutputLogger local_a0;
  OneLineParser local_60;
  
  local_d8 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_d0 = "rev-list";
  local_c8 = "-n";
  local_c0 = "1";
  local_b8 = "HEAD";
  local_b0 = "--";
  local_a8 = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  OneLineParser::OneLineParser(&local_60,this,"rl-out> ",__return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            (&local_a0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"rl-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,&local_d8,(OutputParser *)&local_60,
                      (OutputParser *)&local_a0,(char *)0x0,Auto);
  local_a0.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_007830e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.super_LineParser.Line._M_dataplus._M_p != &local_a0.super_LineParser.Line.field_2)
  {
    operator_delete(local_a0.super_LineParser.Line._M_dataplus._M_p,
                    local_a0.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_60.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_007830e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.super_LineParser.Line._M_dataplus._M_p != &local_60.super_LineParser.Line.field_2)
  {
    operator_delete(local_60.super_LineParser.Line._M_dataplus._M_p,
                    local_60.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestGIT::GetWorkingRevision()
{
  // Run plumbing "git rev-list" to get work tree revision.
  const char* git = this->CommandLineTool.c_str();
  const char* git_rev_list[] = { git,    "rev-list", "-n",      "1",
                                 "HEAD", "--",       CM_NULLPTR };
  std::string rev;
  OneLineParser out(this, "rl-out> ", rev);
  OutputLogger err(this->Log, "rl-err> ");
  this->RunChild(git_rev_list, &out, &err);
  return rev;
}